

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O1

bool QLocalServerPrivate::removeServer(QString *name)

{
  undefined8 uVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  char cVar5;
  undefined1 uVar6;
  long in_FS_OFFSET;
  QArrayData *local_70;
  QStringBuilder<char16_t,_const_QString_&> local_58;
  qsizetype local_48;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x0;
  local_38.d.size = 0;
  cVar5 = QString::startsWith((QChar)(char16_t)name,0x2f);
  if (cVar5 == '\0') {
    QDir::tempPath();
    QDir::cleanPath((QString *)&local_58);
    pcVar4 = local_38.d.ptr;
    pDVar3 = local_38.d.d;
    qVar2 = local_48;
    uVar1 = local_58._0_8_;
    local_58._0_8_ = local_38.d.d;
    local_38.d.d = (Data *)uVar1;
    local_38.d.ptr = (char16_t *)local_58.b;
    local_58.b = (QString *)pcVar4;
    local_48 = local_38.d.size;
    local_38.d.size = qVar2;
    if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
      }
    }
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,2,0x10);
      }
    }
    local_58.a = 0x2f;
    local_58.b = name;
    operator+=(&local_38,&local_58);
  }
  else {
    QString::operator=(&local_38,(QString *)name);
  }
  cVar5 = QFile::exists((QString *)&local_38);
  uVar6 = 1;
  if (cVar5 != '\0') {
    uVar6 = QFile::remove((QString *)&local_38);
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)uVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QLocalServerPrivate::removeServer(const QString &name)
{
    QString fileName;
    if (name.startsWith(u'/')) {
        fileName = name;
    } else {
        fileName = QDir::cleanPath(QDir::tempPath());
        fileName += u'/' + name;
    }
    if (QFile::exists(fileName))
        return QFile::remove(fileName);
    else
        return true;
}